

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint8_t * cfd::core::ConfidentialTransaction::CopyConfidentialCommitment
                    (void *buffer,size_t buffer_size,size_t explicit_size,uint8_t *address)

{
  uint8_t *puVar1;
  size_t max_size;
  uint8_t ct_buffer [33];
  
  if (buffer_size == 0 || buffer == (void *)0x0) {
LAB_0020e89b:
    *address = '\0';
    puVar1 = address + 1;
  }
  else {
    if (*buffer != '\x01') {
      if (*buffer == '\0') goto LAB_0020e89b;
      explicit_size = 0x21;
    }
    if (explicit_size < buffer_size) {
      buffer_size = explicit_size;
    }
    ct_buffer[0x10] = '\0';
    ct_buffer[0x11] = '\0';
    ct_buffer[0x12] = '\0';
    ct_buffer[0x13] = '\0';
    ct_buffer[0x14] = '\0';
    ct_buffer[0x15] = '\0';
    ct_buffer[0x16] = '\0';
    ct_buffer[0x17] = '\0';
    ct_buffer[0x18] = '\0';
    ct_buffer[0x19] = '\0';
    ct_buffer[0x1a] = '\0';
    ct_buffer[0x1b] = '\0';
    ct_buffer[0x1c] = '\0';
    ct_buffer[0x1d] = '\0';
    ct_buffer[0x1e] = '\0';
    ct_buffer[0x1f] = '\0';
    ct_buffer[0] = '\0';
    ct_buffer[1] = '\0';
    ct_buffer[2] = '\0';
    ct_buffer[3] = '\0';
    ct_buffer[4] = '\0';
    ct_buffer[5] = '\0';
    ct_buffer[6] = '\0';
    ct_buffer[7] = '\0';
    ct_buffer[8] = '\0';
    ct_buffer[9] = '\0';
    ct_buffer[10] = '\0';
    ct_buffer[0xb] = '\0';
    ct_buffer[0xc] = '\0';
    ct_buffer[0xd] = '\0';
    ct_buffer[0xe] = '\0';
    ct_buffer[0xf] = '\0';
    ct_buffer[0x20] = '\0';
    memcpy(ct_buffer,buffer,buffer_size);
    memcpy(address,ct_buffer,explicit_size);
    puVar1 = address + explicit_size;
  }
  return puVar1;
}

Assistant:

uint8_t *ConfidentialTransaction::CopyConfidentialCommitment(
    const void *buffer, size_t buffer_size, size_t explicit_size,
    uint8_t *address) {
  uint8_t *result = address;
  const uint8_t *buffer_addr = static_cast<const uint8_t *>(buffer);
  if ((!buffer_addr) || (buffer_size == 0) || (buffer_addr[0] == 0)) {
    *result = 0;  // version is 0
    ++result;
  } else {
    size_t max_size = kConfidentialDataSize;
    if (buffer_addr[0] == kConfidentialVersion_1) {
      max_size = explicit_size;
    }
    size_t copy_size = max_size;
    if (buffer_size <= copy_size) {
      copy_size = buffer_size;
    }
    // explicit value
    // confidential value
    uint8_t ct_buffer[kConfidentialDataSize];
    memset(ct_buffer, 0, sizeof(ct_buffer));
    memcpy(ct_buffer, buffer_addr, copy_size);
    memcpy(address, ct_buffer, max_size);
    result += max_size;
  }
  return result;
}